

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O0

void idle_cb(uv_idle_t *handle)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  void *eval_b;
  void *eval_a;
  int r;
  uv_idle_t *handle_local;
  
  if (send_req.handle != (uv_udp_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-hang-loop.c"
            ,0x2f,"send_req.handle","==","NULL",send_req.handle,"==",0);
    abort();
  }
  if (handle == &idle_handle) {
    iVar1 = uv_idle_stop(&idle_handle);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-hang-loop.c"
              ,0x31,"uv_idle_stop(handle)","==","0",(long)iVar1,"==",0);
      abort();
    }
    loop_hang_called = loop_hang_called + 1;
    if (loop_hang_called < 0x3e9) {
      iVar1 = uv_udp_send(&send_req,&client,&buf,1,(sockaddr *)&addr,send_cb);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-hang-loop.c"
                ,0x40,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
    }
    else {
      uv_close((uv_handle_t *)&client,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&idle_handle,(uv_close_cb)0x0);
    }
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-hang-loop.c"
          ,0x30,"(uv_idle_t*)(handle)","==","&(idle_handle)",handle,"==",&idle_handle);
  abort();
}

Assistant:

static void idle_cb(uv_idle_t* handle) {
  int r;

  ASSERT_NULL(send_req.handle);
  CHECK_OBJECT(handle, uv_idle_t, idle_handle);
  ASSERT_OK(uv_idle_stop(handle));

  /* It probably would have stalled by now if it's going to stall at all. */
  if (++loop_hang_called > 1000) {
    uv_close((uv_handle_t*) &client, NULL);
    uv_close((uv_handle_t*) &idle_handle, NULL);
    return;
  }

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);
}